

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O0

void __thiscall
asio::ssl::detail::
io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
::operator()(io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  long lVar1;
  bool bVar2;
  want wVar3;
  cancellation_type_t cVar4;
  size_t sVar5;
  error_code *peVar6;
  base_from_cancellation_state<std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_void>
  *pbVar7;
  long in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  base_from_cancellation_state<std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_void>
  *in_RDI;
  int in_R8D;
  const_buffer cVar8;
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
  *in_stack_fffffffffffffe88;
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
  *in_stack_fffffffffffffe90;
  _Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
  *in_stack_fffffffffffffe98;
  _Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
  *handler;
  error_code *in_stack_fffffffffffffea0;
  engine *in_stack_fffffffffffffea8;
  type_conflict tVar9;
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
  *in_stack_fffffffffffffeb0;
  mutable_buffer *in_stack_fffffffffffffeb8;
  mutable_buffer *in_stack_fffffffffffffec0;
  engine *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  engine *in_stack_fffffffffffffed8;
  void *local_c8;
  size_t local_c0;
  undefined8 local_a8;
  undefined8 local_a0;
  void *local_38;
  size_t local_30;
  long local_20;
  undefined4 uStack_c;
  
  *(int *)(in_RDI + 0x14) = in_R8D;
  local_20 = in_RCX;
  if (in_R8D != 1) goto LAB_0029cda2;
  do {
    wVar3 = handshake_op::operator()
                      ((handshake_op *)in_stack_fffffffffffffea0,(engine *)in_stack_fffffffffffffe98
                       ,(error_code *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88)
    ;
    *(want *)(in_RDI + 0x18) = wVar3;
    if (wVar3 == want_input_and_retry) {
      sVar5 = const_buffer::size((const_buffer *)(*(long *)(in_RDI + 8) + 0x150));
      if (sVar5 == 0) {
        stream_core::expiry((steady_timer *)in_stack_fffffffffffffe88);
        stream_core::neg_infin();
        bVar2 = std::chrono::operator==
                          ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffea0,
                           (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffe98);
        if (!bVar2) {
          basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
          ::
          async_wait<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
                    ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                      *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          return;
        }
        stream_core::pos_infin();
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
        ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                      *)in_stack_fffffffffffffeb0,(time_point *)in_stack_fffffffffffffea8);
        asio::buffer((mutable_buffer *)0x29cbf9);
        basic_stream_socket<asio::ip::tcp,asio::any_io_executor>::
        async_read_some<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
                  ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)
                   in_stack_fffffffffffffea0,(mutable_buffers_1 *)in_stack_fffffffffffffe98,
                   in_stack_fffffffffffffe90);
        return;
      }
      cVar8 = engine::put_input(in_stack_fffffffffffffed8,
                                (const_buffer *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      lVar1 = *(long *)(in_RDI + 8);
      local_38 = cVar8.data_;
      *(void **)(lVar1 + 0x150) = local_38;
      local_30 = cVar8.size_;
      *(size_t *)(lVar1 + 0x158) = local_30;
    }
    else {
      if ((wVar3 == want_output_and_retry) || (wVar3 == want_output)) {
        stream_core::expiry((steady_timer *)in_stack_fffffffffffffe88);
        stream_core::neg_infin();
        bVar2 = std::chrono::operator==
                          ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffea0,
                           (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffe98);
        if (!bVar2) {
          basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
          ::
          async_wait<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
                    ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                      *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          return;
        }
        stream_core::pos_infin();
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
        ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                      *)in_stack_fffffffffffffeb0,(time_point *)in_stack_fffffffffffffea8);
        tVar9 = (type_conflict)((ulong)in_stack_fffffffffffffea8 >> 0x20);
        engine::get_output(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
                  ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)
                   in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                   tVar9);
        return;
      }
      if (in_R8D != 0) {
        asio::buffer((mutable_buffer *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
        basic_stream_socket<asio::ip::tcp,asio::any_io_executor>::
        async_read_some<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
                  ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)
                   in_stack_fffffffffffffea0,(mutable_buffers_1 *)in_stack_fffffffffffffe98,
                   in_stack_fffffffffffffe90);
        return;
      }
LAB_0029cda2:
      if (local_20 == -1) {
        local_20 = 0;
      }
      else {
        bVar2 = std::error_code::operator_cast_to_bool((error_code *)(in_RDI + 0x20));
        if (!bVar2) {
          *(ulong *)(in_RDI + 0x20) = CONCAT44(uStack_c,in_ESI);
          *(undefined8 *)(in_RDI + 0x28) = in_RDX;
        }
      }
      in_stack_fffffffffffffed4 = *(int *)(in_RDI + 0x18);
      if (in_stack_fffffffffffffed4 == -2) {
        asio::buffer((mutable_buffer *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
        const_buffer::const_buffer
                  ((const_buffer *)in_stack_fffffffffffffe90,
                   (mutable_buffer *)in_stack_fffffffffffffe88);
        lVar1 = *(long *)(in_RDI + 8);
        *(undefined8 *)(lVar1 + 0x150) = local_a8;
        *(undefined8 *)(lVar1 + 0x158) = local_a0;
        cVar8 = engine::put_input(in_stack_fffffffffffffed8,
                                  (const_buffer *)
                                  CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        lVar1 = *(long *)(in_RDI + 8);
        local_c8 = cVar8.data_;
        *(void **)(lVar1 + 0x150) = local_c8;
        local_c0 = cVar8.size_;
        *(size_t *)(lVar1 + 0x158) = local_c0;
        in_stack_fffffffffffffec8 = (engine *)(*(long *)(in_RDI + 8) + 0x10);
        stream_core::neg_infin();
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
        ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                      *)in_stack_fffffffffffffeb0,(time_point *)in_stack_fffffffffffffea8);
        cVar4 = asio::detail::
                base_from_cancellation_state<std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_void>
                ::cancelled(in_RDI);
        if (cVar4 != none) {
          std::error_code::operator=
                    ((error_code *)in_stack_fffffffffffffeb0,
                     (basic_errors)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        }
      }
      else {
        if (in_stack_fffffffffffffed4 != -1) {
          if (in_stack_fffffffffffffed4 == 1) {
            stream_core::neg_infin();
            basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
            ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                          *)in_stack_fffffffffffffeb0,(time_point *)in_stack_fffffffffffffea8);
          }
          peVar6 = (error_code *)(in_RDI + 0x10);
          engine::map_error_code((engine *)(in_RDI + 0x38),peVar6);
          bVar2 = std::error_code::operator_cast_to_bool((error_code *)(in_RDI + 0x20));
          if (bVar2) {
            handler = (_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
                       *)0x0;
          }
          else {
            handler = *(_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
                        **)(in_RDI + 0x30);
          }
          handshake_op::
          call_handler<std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>
                    ((handshake_op *)peVar6,handler,(error_code *)in_stack_fffffffffffffe90,
                     (size_t *)in_stack_fffffffffffffe88);
          return;
        }
        in_stack_fffffffffffffec0 = (mutable_buffer *)(*(long *)(in_RDI + 8) + 0x88);
        stream_core::neg_infin();
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
        ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                      *)in_stack_fffffffffffffeb0,(time_point *)in_stack_fffffffffffffea8);
        cVar4 = asio::detail::
                base_from_cancellation_state<std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_void>
                ::cancelled(in_RDI);
        if (cVar4 != none) {
          std::error_code::operator=
                    ((error_code *)in_stack_fffffffffffffeb0,
                     (basic_errors)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        }
      }
    }
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)(in_RDI + 0x20));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      pbVar7 = in_RDI + 0x10;
      peVar6 = (error_code *)(in_RDI + 0x38);
      engine::map_error_code(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      handshake_op::
      call_handler<std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>
                ((handshake_op *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,peVar6,
                 (size_t *)pbVar7);
      return;
    }
  } while( true );
}

Assistant:

void operator()(asio::error_code ec,
      std::size_t bytes_transferred = ~std::size_t(0), int start = 0)
  {
    switch (start_ = start)
    {
    case 1: // Called after at least one async operation.
      do
      {
        switch (want_ = op_(core_.engine_, ec_, bytes_transferred_))
        {
        case engine::want_input_and_retry:

          // If the input buffer already has data in it we can pass it to the
          // engine and then retry the operation immediately.
          if (core_.input_.size() != 0)
          {
            core_.input_ = core_.engine_.put_input(core_.input_);
            continue;
          }

          // The engine wants more data to be read from input. However, we
          // cannot allow more than one read operation at a time on the
          // underlying transport. The pending_read_ timer's expiry is set to
          // pos_infin if a read is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_read_) == core_.neg_infin())
          {
            // Prevent other read operations from being started.
            core_.pending_read_.expires_at(core_.pos_infin());

            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Start reading some data from the underlying transport.
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Wait until the current read operation completes.
            core_.pending_read_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        case engine::want_output_and_retry:
        case engine::want_output:

          // The engine wants some data to be written to the output. However, we
          // cannot allow more than one write operation at a time on the
          // underlying transport. The pending_write_ timer's expiry is set to
          // pos_infin if a write is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_write_) == core_.neg_infin())
          {
            // Prevent other write operations from being started.
            core_.pending_write_.expires_at(core_.pos_infin());

            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Start writing all the data to the underlying transport.
            asio::async_write(next_layer_,
                core_.engine_.get_output(core_.output_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Wait until the current write operation completes.
            core_.pending_write_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        default:

          // The SSL operation is done and we can invoke the handler, but we
          // have to keep in mind that this function might be being called from
          // the async operation's initiating function. In this case we're not
          // allowed to call the handler directly. Instead, issue a zero-sized
          // read so the handler runs "as-if" posted using io_context::post().
          if (start)
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_, 0),
                ASIO_MOVE_CAST(io_op)(*this));

            // Yield control until asynchronous operation completes. Control
            // resumes at the "default:" label below.
            return;
          }
          else
          {
            // Continue on to run handler directly.
            break;
          }
        }

        default:
        if (bytes_transferred == ~std::size_t(0))
          bytes_transferred = 0; // Timer cancellation, no data transferred.
        else if (!ec_)
          ec_ = ec;

        switch (want_)
        {
        case engine::want_input_and_retry:

          // Add received data to the engine's input.
          core_.input_ = asio::buffer(
              core_.input_buffer_, bytes_transferred);
          core_.input_ = core_.engine_.put_input(core_.input_);

          // Release any waiting read operations.
          core_.pending_read_.expires_at(core_.neg_infin());

          // Check for cancellation before continuing.
          if (this->cancelled() != cancellation_type::none)
          {
            ec_ = asio::error::operation_aborted;
            break;
          }

          // Try the operation again.
          continue;

        case engine::want_output_and_retry:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Check for cancellation before continuing.
          if (this->cancelled() != cancellation_type::none)
          {
            ec_ = asio::error::operation_aborted;
            break;
          }

          // Try the operation again.
          continue;

        case engine::want_output:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Fall through to call handler.

        default:

          // Pass the result to the handler.
          op_.call_handler(handler_,
              core_.engine_.map_error_code(ec_),
              ec_ ? 0 : bytes_transferred_);

          // Our work here is done.
          return;
        }
      } while (!ec_);

      // Operation failed. Pass the result to the handler.
      op_.call_handler(handler_, core_.engine_.map_error_code(ec_), 0);
    }
  }